

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_propertyi(nk_context *ctx,char *name,int min,int val,int max,int step,float inc_per_pixel)

{
  nk_property_variant local_88;
  undefined1 local_60 [8];
  nk_property_variant variant;
  float inc_per_pixel_local;
  int step_local;
  int max_local;
  int val_local;
  int min_local;
  char *name_local;
  nk_context *ctx_local;
  
  variant.step._4_4_ = inc_per_pixel;
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4dca,
                  "int nk_propertyi(struct nk_context *, const char *, int, int, int, int, float)");
  }
  if (name == (char *)0x0) {
    __assert_fail("name",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4dcb,
                  "int nk_propertyi(struct nk_context *, const char *, int, int, int, int, float)");
  }
  ctx_local._4_4_ = val;
  if (((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) && (name != (char *)0x0)) {
    nk_property_variant_int(&local_88,val,min,max,step);
    memcpy(local_60,&local_88,0x28);
    nk_property(ctx,name,(nk_property_variant *)local_60,(float)variant.step._4_4_,NK_FILTER_INT);
    ctx_local._4_4_ = variant.kind;
  }
  return ctx_local._4_4_;
}

Assistant:

NK_API int
nk_propertyi(struct nk_context *ctx, const char *name, int min, int val,
    int max, int step, float inc_per_pixel)
{
    struct nk_property_variant variant;
    NK_ASSERT(ctx);
    NK_ASSERT(name);

    if (!ctx || !ctx->current || !name) return val;
    variant = nk_property_variant_int(val, min, max, step);
    nk_property(ctx, name, &variant, inc_per_pixel, NK_FILTER_INT);
    val = variant.value.i;
    return val;
}